

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O3

void QGraphicsOpacityEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  code *pcVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  QBrush *mask;
  long in_FS_OFFSET;
  qreal opacity;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_30 = *_a[1];
      local_20 = &local_30;
      iVar5 = 0;
      break;
    case 1:
      local_20 = (undefined8 *)_a[1];
      iVar5 = 1;
      break;
    case 2:
      opacity = *_a[1];
LAB_003949e9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setOpacity((QGraphicsOpacityEffect *)_o,opacity);
        return;
      }
      goto LAB_00394a62;
    case 3:
      mask = (QBrush *)_a[1];
LAB_00394a09:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setOpacityMask((QGraphicsOpacityEffect *)_o,mask);
        return;
      }
      goto LAB_00394a62;
    default:
      goto switchD_003948de_caseD_3;
    }
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_28);
    break;
  case ReadProperty:
    puVar1 = (undefined8 *)*_a;
    if (_id == 1) {
      QBrush::QBrush((QBrush *)&local_28,(QBrush *)(*(long *)(_o + 8) + 0xb0));
      pvVar4 = (void *)*puVar1;
      *puVar1 = local_28;
      local_28 = pvVar4;
      QBrush::~QBrush((QBrush *)&local_28);
    }
    else if (_id == 0) {
      *puVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0xa8);
    }
    break;
  case WriteProperty:
    mask = (QBrush *)*_a;
    if (_id == 1) goto LAB_00394a09;
    if (_id == 0) {
      opacity = *(qreal *)mask;
      goto LAB_003949e9;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == opacityChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == opacityMaskChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
switchD_003948de_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00394a62:
  __stack_chk_fail();
}

Assistant:

void QGraphicsOpacityEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsOpacityEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->opacityChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 1: _t->opacityMaskChanged((*reinterpret_cast< std::add_pointer_t<QBrush>>(_a[1]))); break;
        case 2: _t->setOpacity((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 3: _t->setOpacityMask((*reinterpret_cast< std::add_pointer_t<QBrush>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsOpacityEffect::*)(qreal )>(_a, &QGraphicsOpacityEffect::opacityChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsOpacityEffect::*)(const QBrush & )>(_a, &QGraphicsOpacityEffect::opacityMaskChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<qreal*>(_v) = _t->opacity(); break;
        case 1: *reinterpret_cast<QBrush*>(_v) = _t->opacityMask(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOpacity(*reinterpret_cast<qreal*>(_v)); break;
        case 1: _t->setOpacityMask(*reinterpret_cast<QBrush*>(_v)); break;
        default: break;
        }
    }
}